

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

void formatGestureHeader(QDebug *d,char *className,QGesture *gesture)

{
  long lVar1;
  bool bVar2;
  QPointF *in_RSI;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  QDebug *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::operator<<(in_stack_ffffffffffffffe8,(char *)d);
  QDebug::operator<<(in_stack_ffffffffffffffe8,(char *)d);
  QGesture::state((QGesture *)0x2fd408);
  QtDebugUtils::formatQEnum<Qt::GestureState>
            (in_stack_ffffffffffffffe8,(GestureState)((ulong)in_RDI >> 0x20));
  bVar2 = QGesture::hasHotSpot((QGesture *)0x2fd41d);
  if (bVar2) {
    QDebug::operator<<(in_stack_ffffffffffffffe8,(char *)d);
    QGesture::hotSpot((QGesture *)in_RSI);
    QtDebugUtils::formatQPoint<QPointF>(in_RDI,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void formatGestureHeader(QDebug d, const char *className, const QGesture *gesture)
{
     d << className << "(state=";
     QtDebugUtils::formatQEnum(d, gesture->state());
     if (gesture->hasHotSpot()) {
         d << ",hotSpot=";
         QtDebugUtils::formatQPoint(d, gesture->hotSpot());
     }
}